

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>
          (MessageGenerator *this,FieldDescriptor *field,Printer *p,int *cached_has_word_index)

{
  long *plVar1;
  long lVar2;
  anon_class_1_0_00000001 local_321;
  Printer *local_320;
  string local_318;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d8;
  Printer *local_2b8;
  FieldDescriptor *local_2b0;
  undefined1 local_2a8 [16];
  MessageGenerator *local_298;
  anon_class_24_3_0cc8e12b_for_cb local_290;
  anon_class_32_4_7d5c8e9e_for_cb local_278;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_320 = p;
  local_2b8 = p;
  local_2b0 = field;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"comment","");
  local_290.p = &local_2b8;
  local_290.field = &local_2b0;
  local_290.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_1_>
            (&local_258,&local_318,&local_290);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"update_cached_has_bits","");
  local_278.this = this;
  local_278.field = &local_2b0;
  local_278.p = &local_2b8;
  local_278.cached_has_word_index = cached_has_word_index;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_2_>
            (&local_1a0,&local_2d8,&local_278);
  local_2f8._0_8_ = &local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f8,"check_and_update_byte_size_for_field","");
  local_2a8._0_8_ = &local_2b0;
  local_2a8._8_8_ = &local_2b8;
  local_298 = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_3_>
            (&local_e8,(string *)local_2f8,(anon_class_24_3_4e50317f_for_cb *)local_2a8);
  io::Printer::Emit(local_320,&local_258,3,0x6c,
                    "\n        $comment$;\n        $update_cached_has_bits$;\n        $check_and_update_byte_size_for_field$;\n      "
                   );
  lVar2 = 0x228;
  do {
    if (*(char *)((long)&local_278.cached_has_word_index + lVar2) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_2a8 + lVar2 + 8));
    }
    plVar1 = *(long **)((long)&local_2d8.field_2 + lVar2);
    if ((long *)((long)&local_2b8 + lVar2) != plVar1) {
      operator_delete(plVar1,*(long *)((long)&local_2b8 + lVar2) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&local_2d8._M_string_length + lVar2)]._M_data)
              (&local_321,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_2f8 + lVar2 + 8));
    *(undefined1 *)((long)&local_2d8._M_string_length + lVar2) = 0xff;
    if ((long *)(local_2f8 + lVar2 + -8) != *(long **)(local_2f8 + lVar2 + -0x18)) {
      operator_delete(*(long **)(local_2f8 + lVar2 + -0x18),*(long *)(local_2f8 + lVar2 + -8) + 1);
    }
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != &local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageGenerator::EmitUpdateByteSizeForField(
    const FieldDescriptor* field, io::Printer* p,
    int& cached_has_word_index) const {
  p->Emit(
      {{"comment", [&] { PrintFieldComment(Formatter{p}, field, options_); }},
       {"update_cached_has_bits",
        [&] { MaybeEmitUpdateCachedHasbits(field, p, cached_has_word_index); }},
       {"check_and_update_byte_size_for_field",
        [&]() { EmitCheckAndUpdateByteSizeForField<kIsV2>(field, p); }}},
      R"cc(
        $comment$;
        $update_cached_has_bits$;
        $check_and_update_byte_size_for_field$;
      )cc");
}